

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void google::protobuf::internal::FailDynamicCast(MessageLite *from,MessageLite *to)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  string_view v;
  string_view v_00;
  LogMessage LStack_38;
  
  v = MessageLite::GetTypeName(to);
  iVar1 = (*from->_vptr_MessageLite[4])(from);
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x3d) == '\x01') {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xd5);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&LStack_38,
                        (char (*) [57])"Cannot downcast from a DynamicMessage to generated type ");
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  }
  else {
    v_00 = MessageLite::GetTypeName(from);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xda);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&LStack_38,(char (*) [17])"Cannot downcast ");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v_00);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])0x417192)
    ;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void FailDynamicCast(const MessageLite& from, const MessageLite& to) {
  const auto to_name = to.GetTypeName();
  if (internal::GetClassData(from)->is_dynamic) {
    ABSL_LOG(FATAL)
        << "Cannot downcast from a DynamicMessage to generated type "
        << to_name;
  }
  const auto from_name = from.GetTypeName();
  ABSL_LOG(FATAL) << "Cannot downcast " << from_name << " to " << to_name;
}